

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalNinjaGenerator::WriteCustomCommandBuildStatement
          (cmLocalNinjaGenerator *this,cmCustomCommand *cc,
          set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
          *targets,string *fileConfig)

{
  pointer *ppbVar1;
  cmGeneratorTarget *pcVar2;
  cmMakefile *this_00;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  PolicyStatus PVar7;
  reference this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  cmGlobalNinjaGenerator *pcVar9;
  reference ppcVar10;
  string *psVar11;
  size_type sVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths;
  cmSourceFile *this_02;
  reference pvVar13;
  iterator __first;
  cmGeneratedFileStream *os;
  ulong uVar14;
  string *__rhs;
  cmake *this_03;
  cmListFileBacktrace *backtrace;
  PolicyID id;
  string_view input;
  byte local_6ba;
  bool local_671;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_570;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_558;
  CCOutputs local_540;
  string local_508;
  string local_4e8;
  undefined1 local_4c8 [8];
  string comment;
  string local_488;
  byte local_463;
  byte local_462;
  allocator<char> local_461;
  string local_460;
  undefined1 local_440 [8];
  string depfile;
  string local_410;
  string local_3f0 [32];
  undefined1 local_3d0 [8];
  cmCryptoHash hash;
  string customStep;
  allocator<char> local_379;
  string local_378;
  undefined1 local_358 [8];
  cmNinjaBuild build;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_221;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_220;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_218;
  undefined1 local_210 [8];
  cmNinjaDeps sortedOrderOnlyDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmdLines;
  cmNinjaDeps ninjaDeps;
  string mainOutput;
  CCOutputs ccOutputs;
  string local_168;
  cmSourceFile *local_148;
  cmSourceFile *sf;
  string *output;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool symbolic;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  undefined1 local_100 [8];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  jDeps;
  _Self local_c0;
  _Self local_b8;
  iterator j;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  orderOnlyDeps;
  cmCustomCommandGenerator *ccg;
  iterator __end1;
  iterator __begin1;
  vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *__range1;
  vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> ccgs;
  cmGlobalNinjaGenerator *gg;
  string *fileConfig_local;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  *targets_local;
  cmCustomCommand *cc_local;
  cmLocalNinjaGenerator *this_local;
  
  ccgs.super__Vector_base<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)GetGlobalNinjaGenerator(this);
  bVar4 = cmGlobalNinjaGenerator::SeenCustomCommand
                    ((cmGlobalNinjaGenerator *)
                     ccgs.
                     super__Vector_base<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,cc,fileConfig);
  if (!bVar4) {
    (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[0xf])(&__range1,this,cc,fileConfig);
    __end1 = std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>::begin
                       ((vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                         *)&__range1);
    ccg = (cmCustomCommandGenerator *)
          std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>::end
                    ((vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *)
                     &__range1);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<cmCustomCommandGenerator_*,_std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>_>
                                       *)&ccg), bVar4) {
      this_01 = __gnu_cxx::
                __normal_iterator<cmCustomCommandGenerator_*,_std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>_>
                ::operator*(&__end1);
      pvVar8 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(this_01);
      bVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(pvVar8);
      if (bVar4) {
        pvVar8 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(this_01);
        bVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(pvVar8);
        if (!bVar4) goto LAB_008d5137;
      }
      else {
LAB_008d5137:
        std::
        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&j);
        bVar4 = cmCustomCommand::GetDependsExplicitOnly(cc);
        if (!bVar4) {
          local_b8._M_node =
               (_Base_ptr)
               std::
               set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
               ::begin(targets);
          local_c0._M_node =
               (_Base_ptr)
               std::
               set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
               ::end(targets);
          bVar4 = std::operator!=(&local_b8,&local_c0);
          if (!bVar4) {
            __assert_fail("j != targets.end()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLocalNinjaGenerator.cxx"
                          ,0x281,
                          "void cmLocalNinjaGenerator::WriteCustomCommandBuildStatement(const cmCustomCommand *, const std::set<cmGeneratorTarget *> &, const std::string &)"
                         );
          }
          pcVar9 = GetGlobalNinjaGenerator(this);
          ppcVar10 = std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator*(&local_b8);
          pcVar2 = *ppcVar10;
          psVar11 = cmCustomCommandGenerator::GetOutputConfig_abi_cxx11_(this_01);
          sVar12 = std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                   ::size((vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                           *)&__range1);
          cmGlobalNinjaGenerator::AppendTargetDependsClosure
                    (pcVar9,pcVar2,
                     (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&j,psVar11,fileConfig,1 < sVar12,true);
          std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator++(&local_b8);
          while( true ) {
            jDeps._M_h._M_single_bucket =
                 (__node_base_ptr)
                 std::
                 set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                 ::end(targets);
            bVar4 = std::operator!=(&local_b8,(_Self *)&jDeps._M_h._M_single_bucket);
            if (!bVar4) break;
            std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_100);
            pcVar9 = GetGlobalNinjaGenerator(this);
            ppcVar10 = std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator*(&local_b8);
            pcVar2 = *ppcVar10;
            psVar11 = cmCustomCommandGenerator::GetOutputConfig_abi_cxx11_(this_01);
            sVar12 = std::
                     vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>::
                     size((vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                           *)&__range1);
            cmGlobalNinjaGenerator::AppendTargetDependsClosure
                      (pcVar9,pcVar2,
                       (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_100,psVar11,fileConfig,1 < sVar12,true);
            ::cm::
            erase_if<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>,cmLocalNinjaGenerator::WriteCustomCommandBuildStatement(cmCustomCommand_const*,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>const&,std::__cxx11::string_const&)::__0>
                      ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&j,(unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_100);
            std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_100);
            std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator++(&local_b8);
          }
        }
        pvVar8 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(this_01);
        paths = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(this_01);
        bVar4 = false;
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar8);
        output = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(pvVar8);
        while (bVar5 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&output), bVar5) {
          sf = (cmSourceFile *)
               __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
          this_02 = cmMakefile::GetSource
                              ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,
                               (string *)sf,Ambiguous);
          local_148 = this_02;
          if (this_02 != (cmSourceFile *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_168,"SYMBOLIC",
                       (allocator<char> *)
                       ((long)&ccOutputs.WorkDirOuts.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            bVar5 = cmSourceFile::GetPropertyAsBool(this_02,&local_168);
            std::__cxx11::string::~string((string *)&local_168);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&ccOutputs.WorkDirOuts.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            if (bVar5) {
              bVar4 = true;
              break;
            }
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
        cmGlobalNinjaGenerator::CCOutputs::CCOutputs
                  ((CCOutputs *)((long)&mainOutput.field_2 + 8),
                   (cmGlobalNinjaGenerator *)
                   ccgs.
                   super__Vector_base<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmGlobalNinjaGenerator::CCOutputs::Add((CCOutputs *)((long)&mainOutput.field_2 + 8),pvVar8);
        cmGlobalNinjaGenerator::CCOutputs::Add((CCOutputs *)((long)&mainOutput.field_2 + 8),paths);
        pvVar13 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&ccOutputs,0);
        std::__cxx11::string::string
                  ((string *)
                   &ninjaDeps.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar13);
        ppbVar1 = &cmdLines.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ppbVar1);
        AppendCustomCommandDeps(this,this_01,(cmNinjaDeps *)ppbVar1,fileConfig);
        ppbVar1 = &sortedOrderOnlyDeps.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ppbVar1);
        AppendCustomCommandLines
                  (this,this_01,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)ppbVar1);
        local_218._M_cur =
             (__node_type *)
             std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&j);
        local_220._M_cur =
             (__node_type *)
             std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&j);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_221);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<std::__detail::_Node_iterator<std::__cxx11::string,true,true>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_210,
                   (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    )local_218._M_cur,
                   (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    )local_220._M_cur,&local_221);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_221);
        __first = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_210);
        build.RspFile.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_210);
        std::
        sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__first._M_current,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )build.RspFile.field_2._8_8_);
        bVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&sortedOrderOnlyDeps.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar5) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_378,"phony",&local_379);
          cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_358,&local_378);
          std::__cxx11::string::~string((string *)&local_378);
          std::allocator<char>::~allocator(&local_379);
          cmStrCat<char_const(&)[26],std::__cxx11::string&>
                    ((string *)((long)&customStep.field_2 + 8),
                     (char (*) [26])"Phony custom command for ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ninjaDeps.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::operator=
                    ((string *)local_358,(string *)(customStep.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(customStep.field_2._M_local_buf + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&build.Rule.field_2 + 8),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&ccOutputs);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&build.ImplicitOuts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&ccOutputs.ExplicitOuts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&build.WorkDirOuts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&cmdLines.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&build.ImplicitDeps.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_210);
          pcVar3 = ccgs.
                   super__Vector_base<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          os = GetImplFileStream(this,fileConfig);
          cmGlobalNinjaGenerator::WriteBuild
                    ((cmGlobalNinjaGenerator *)pcVar3,(ostream *)os,(cmNinjaBuild *)local_358,0,
                     (bool *)0x0);
          cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_358);
        }
        else {
          cmsys::SystemTools::GetFilenameName
                    ((string *)&hash.CTX,
                     (string *)
                     &ninjaDeps.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          uVar6 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                    _vptr_cmGlobalGenerator[0x28])();
          if ((uVar6 & 1) != 0) {
            std::__cxx11::string::operator+=((string *)&hash.CTX,'-');
            std::__cxx11::string::operator+=((string *)&hash.CTX,(string *)fileConfig);
            std::__cxx11::string::operator+=((string *)&hash.CTX,'-');
            psVar11 = cmCustomCommandGenerator::GetOutputConfig_abi_cxx11_(this_01);
            std::__cxx11::string::operator+=((string *)&hash.CTX,(string *)psVar11);
          }
          std::__cxx11::string::operator+=((string *)&hash.CTX,'-');
          cmCryptoHash::cmCryptoHash((cmCryptoHash *)local_3d0,AlgoSHA256);
          input = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)
                             &ninjaDeps.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          depfile.field_2._8_8_ = input._M_len;
          cmCryptoHash::HashString_abi_cxx11_(&local_410,(cmCryptoHash *)local_3d0,input);
          std::__cxx11::string::substr((ulong)local_3f0,(ulong)&local_410);
          std::__cxx11::string::operator+=((string *)&hash.CTX,local_3f0);
          std::__cxx11::string::~string(local_3f0);
          std::__cxx11::string::~string((string *)&local_410);
          cmCustomCommandGenerator::GetDepfile_abi_cxx11_((string *)local_440,this_01);
          uVar14 = std::__cxx11::string::empty();
          if (((uVar14 & 1) == 0) && (PVar7 = cmCustomCommand::GetCMP0116Status(cc), PVar7 != OLD))
          {
            if (PVar7 == WARN) {
              local_462 = 0;
              local_463 = 0;
              psVar11 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                                  ((cmLocalGenerator *)this);
              __rhs = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
              bVar5 = std::operator!=(psVar11,__rhs);
              local_671 = true;
              if (!bVar5) {
                this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
                std::allocator<char>::allocator();
                local_462 = 1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_460,"CMAKE_POLICY_WARNING_CMP0116",&local_461);
                local_463 = 1;
                local_671 = cmMakefile::PolicyOptionalWarningEnabled(this_00,&local_460);
              }
              if ((local_463 & 1) != 0) {
                std::__cxx11::string::~string((string *)&local_460);
              }
              if ((local_462 & 1) != 0) {
                std::allocator<char>::~allocator(&local_461);
              }
              if (local_671 != false) {
                this_03 = GetCMakeInstance(this);
                cmPolicies::GetPolicyWarning_abi_cxx11_(&local_488,(cmPolicies *)0x74,id);
                backtrace = cmCustomCommand::GetBacktrace(cc);
                cmake::IssueMessage(this_03,AUTHOR_WARNING,&local_488,backtrace);
                std::__cxx11::string::~string((string *)&local_488);
              }
            }
            else if (PVar7 - NEW < 3) {
              cmCustomCommandGenerator::GetInternalDepfile_abi_cxx11_
                        ((string *)((long)&comment.field_2 + 8),this_01);
              std::__cxx11::string::operator=
                        ((string *)local_440,(string *)(comment.field_2._M_local_buf + 8));
              std::__cxx11::string::~string((string *)(comment.field_2._M_local_buf + 8));
            }
          }
          cmStrCat<char_const(&)[20],std::__cxx11::string&>
                    ((string *)local_4c8,(char (*) [20])"Custom command for ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ninjaDeps.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pcVar3 = ccgs.
                   super__Vector_base<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          psVar11 = cmCustomCommandGenerator::GetOutputConfig_abi_cxx11_(this_01);
          BuildCommandLine(&local_4e8,this,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&sortedOrderOnlyDeps.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar11,fileConfig
                           ,(string *)&hash.CTX,(cmGeneratorTarget *)0x0);
          cmLocalGenerator::ConstructComment_abi_cxx11_
                    (&local_508,(cmLocalGenerator *)this,this_01,"");
          psVar11 = cmCustomCommand::GetJobPool_abi_cxx11_(cc);
          bVar5 = cmCustomCommand::GetUsesTerminal(cc);
          local_6ba = 1;
          if (bVar4) {
            bVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty(paths);
            local_6ba = bVar4 ^ 0xff;
          }
          cmGlobalNinjaGenerator::CCOutputs::CCOutputs
                    (&local_540,(CCOutputs *)((long)&mainOutput.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_558,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&cmdLines.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_570,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_210);
          cmGlobalNinjaGenerator::WriteCustomCommandBuild
                    ((cmGlobalNinjaGenerator *)pcVar3,&local_4e8,&local_508,(string *)local_4c8,
                     (string *)local_440,psVar11,bVar5,(bool)(local_6ba & 1),fileConfig,&local_540,
                     &local_558,&local_570);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_570);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_558);
          cmGlobalNinjaGenerator::CCOutputs::~CCOutputs(&local_540);
          std::__cxx11::string::~string((string *)&local_508);
          std::__cxx11::string::~string((string *)&local_4e8);
          std::__cxx11::string::~string((string *)local_4c8);
          std::__cxx11::string::~string((string *)local_440);
          cmCryptoHash::~cmCryptoHash((cmCryptoHash *)local_3d0);
          std::__cxx11::string::~string((string *)&hash.CTX);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_210);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sortedOrderOnlyDeps.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cmdLines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &ninjaDeps.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmGlobalNinjaGenerator::CCOutputs::~CCOutputs((CCOutputs *)((long)&mainOutput.field_2 + 8));
        std::
        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&j);
      }
      __gnu_cxx::
      __normal_iterator<cmCustomCommandGenerator_*,_std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>_>
      ::operator++(&__end1);
    }
    std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>::~vector
              ((vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *)
               &__range1);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteCustomCommandBuildStatement(
  cmCustomCommand const* cc, const std::set<cmGeneratorTarget*>& targets,
  const std::string& fileConfig)
{
  cmGlobalNinjaGenerator* gg = this->GetGlobalNinjaGenerator();
  if (gg->SeenCustomCommand(cc, fileConfig)) {
    return;
  }

  auto ccgs = this->MakeCustomCommandGenerators(*cc, fileConfig);
  for (cmCustomCommandGenerator const& ccg : ccgs) {
    if (ccg.GetOutputs().empty() && ccg.GetByproducts().empty()) {
      // Generator expressions evaluate to no output for this config.
      continue;
    }

    std::unordered_set<std::string> orderOnlyDeps;

    if (!cc->GetDependsExplicitOnly()) {
      // A custom command may appear on multiple targets.  However, some build
      // systems exist where the target dependencies on some of the targets are
      // overspecified, leading to a dependency cycle.  If we assume all target
      // dependencies are a superset of the true target dependencies for this
      // custom command, we can take the set intersection of all target
      // dependencies to obtain a correct dependency list.
      //
      // FIXME: This won't work in certain obscure scenarios involving indirect
      // dependencies.
      auto j = targets.begin();
      assert(j != targets.end());
      this->GetGlobalNinjaGenerator()->AppendTargetDependsClosure(
        *j, orderOnlyDeps, ccg.GetOutputConfig(), fileConfig, ccgs.size() > 1);
      ++j;

      for (; j != targets.end(); ++j) {
        std::unordered_set<std::string> jDeps;
        this->GetGlobalNinjaGenerator()->AppendTargetDependsClosure(
          *j, jDeps, ccg.GetOutputConfig(), fileConfig, ccgs.size() > 1);
        cm::erase_if(orderOnlyDeps, [&jDeps](std::string const& dep) {
          return jDeps.find(dep) == jDeps.end();
        });
      }
    }

    const std::vector<std::string>& outputs = ccg.GetOutputs();
    const std::vector<std::string>& byproducts = ccg.GetByproducts();

    bool symbolic = false;
    for (std::string const& output : outputs) {
      if (cmSourceFile* sf = this->Makefile->GetSource(output)) {
        if (sf->GetPropertyAsBool("SYMBOLIC")) {
          symbolic = true;
          break;
        }
      }
    }

    cmGlobalNinjaGenerator::CCOutputs ccOutputs(gg);
    ccOutputs.Add(outputs);
    ccOutputs.Add(byproducts);

    std::string mainOutput = ccOutputs.ExplicitOuts[0];

    cmNinjaDeps ninjaDeps;
    this->AppendCustomCommandDeps(ccg, ninjaDeps, fileConfig);

    std::vector<std::string> cmdLines;
    this->AppendCustomCommandLines(ccg, cmdLines);

    cmNinjaDeps sortedOrderOnlyDeps(orderOnlyDeps.begin(),
                                    orderOnlyDeps.end());
    std::sort(sortedOrderOnlyDeps.begin(), sortedOrderOnlyDeps.end());

    if (cmdLines.empty()) {
      cmNinjaBuild build("phony");
      build.Comment = cmStrCat("Phony custom command for ", mainOutput);
      build.Outputs = std::move(ccOutputs.ExplicitOuts);
      build.WorkDirOuts = std::move(ccOutputs.WorkDirOuts);
      build.ExplicitDeps = std::move(ninjaDeps);
      build.OrderOnlyDeps = std::move(sortedOrderOnlyDeps);
      gg->WriteBuild(this->GetImplFileStream(fileConfig), build);
    } else {
      std::string customStep = cmSystemTools::GetFilenameName(mainOutput);
      if (this->GlobalGenerator->IsMultiConfig()) {
        customStep += '-';
        customStep += fileConfig;
        customStep += '-';
        customStep += ccg.GetOutputConfig();
      }
      // Hash full path to make unique.
      customStep += '-';
      cmCryptoHash hash(cmCryptoHash::AlgoSHA256);
      customStep += hash.HashString(mainOutput).substr(0, 7);

      std::string depfile = ccg.GetDepfile();
      if (!depfile.empty()) {
        switch (cc->GetCMP0116Status()) {
          case cmPolicies::WARN:
            if (this->GetCurrentBinaryDirectory() !=
                  this->GetBinaryDirectory() ||
                this->Makefile->PolicyOptionalWarningEnabled(
                  "CMAKE_POLICY_WARNING_CMP0116")) {
              this->GetCMakeInstance()->IssueMessage(
                MessageType::AUTHOR_WARNING,
                cmPolicies::GetPolicyWarning(cmPolicies::CMP0116),
                cc->GetBacktrace());
            }
            CM_FALLTHROUGH;
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            depfile = ccg.GetInternalDepfile();
            break;
        }
      }

      std::string comment = cmStrCat("Custom command for ", mainOutput);
      gg->WriteCustomCommandBuild(
        this->BuildCommandLine(cmdLines, ccg.GetOutputConfig(), fileConfig,
                               customStep),
        this->ConstructComment(ccg), comment, depfile, cc->GetJobPool(),
        cc->GetUsesTerminal(),
        /*restat*/ !symbolic || !byproducts.empty(), fileConfig,
        std::move(ccOutputs), std::move(ninjaDeps),
        std::move(sortedOrderOnlyDeps));
    }
  }
}